

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int strContainsChar(u8 *zStr,int nStr,u32 ch)

{
  uint in_EDX;
  int in_ESI;
  byte *in_RDI;
  long in_FS_OFFSET;
  u32 tst;
  u8 *zEnd;
  u8 *z;
  uint local_38;
  int local_14;
  byte *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDI;
  do {
    if (in_RDI + in_ESI <= local_10) {
      local_14 = 0;
      goto LAB_00226c34;
    }
    if (*local_10 < 0x80) {
      local_38 = (uint)*local_10;
      local_10 = local_10 + 1;
    }
    else {
      local_38 = sqlite3Utf8Read(&local_10);
    }
  } while (local_38 != in_EDX);
  local_14 = 1;
LAB_00226c34:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int strContainsChar(const u8 *zStr, int nStr, u32 ch){
  const u8 *zEnd = &zStr[nStr];
  const u8 *z = zStr;
  while( z<zEnd ){
    u32 tst = Utf8Read(z);
    if( tst==ch ) return 1;
  }
  return 0;
}